

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

int WebPPictureYUVAToARGB(WebPPicture *picture)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  int iVar5;
  int iVar6;
  WebPUpsampleLinePairFunc p_Var7;
  long lVar8;
  long lVar9;
  uint8_t *puVar10;
  uint uVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  WebPEncodingError error;
  uint8_t *puVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  
  iVar5 = 0;
  if (picture != (WebPPicture *)0x0) {
    error = VP8_ENC_ERROR_NULL_PARAMETER;
    if ((((picture->y == (uint8_t *)0x0) || (picture->u == (uint8_t *)0x0)) ||
        (picture->v == (uint8_t *)0x0)) ||
       ((((picture->colorspace & WEBP_CSP_ALPHA_BIT) != WEBP_YUV420 &&
         (picture->a == (uint8_t *)0x0)) ||
        (error = VP8_ENC_ERROR_INVALID_CONFIGURATION,
        (picture->colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420)))) {
      iVar5 = WebPEncodingSetError(picture,error);
      return iVar5;
    }
    iVar6 = WebPPictureAllocARGB(picture);
    iVar5 = 0;
    if (iVar6 != 0) {
      picture->use_argb = 1;
      uVar1 = picture->width;
      uVar2 = picture->height;
      iVar5 = picture->argb_stride;
      puVar4 = picture->argb;
      puVar14 = picture->u;
      puVar13 = picture->v;
      puVar18 = picture->y;
      p_Var7 = WebPGetLinePairConverter(1);
      (*p_Var7)(puVar18,(uint8_t *)0x0,puVar14,puVar13,puVar14,puVar13,(uint8_t *)puVar4,
                (uint8_t *)0x0,uVar1);
      lVar8 = (long)picture->y_stride;
      puVar18 = puVar18 + lVar8;
      lVar9 = (long)(iVar5 * 4);
      puVar16 = (uint8_t *)((long)puVar4 + lVar9);
      if (2 < (int)uVar2) {
        iVar5 = iVar5 << 3;
        puVar17 = (uint8_t *)((long)puVar4 + lVar9 * 2);
        iVar6 = 2;
        puVar10 = puVar13;
        puVar12 = puVar14;
        do {
          puVar14 = puVar12 + picture->uv_stride;
          puVar13 = puVar10 + picture->uv_stride;
          (*p_Var7)(puVar18,puVar18 + (int)lVar8,puVar12,puVar10,puVar14,puVar13,puVar16,puVar17,
                    uVar1);
          lVar8 = (long)picture->y_stride;
          puVar18 = puVar18 + lVar8 * 2;
          puVar16 = puVar16 + iVar5;
          iVar6 = iVar6 + 2;
          puVar17 = puVar17 + iVar5;
          puVar10 = puVar13;
          puVar12 = puVar14;
        } while (iVar6 < (int)uVar2);
      }
      if ((uVar2 & 1) == 0 && 1 < (int)uVar2) {
        (*p_Var7)(puVar18,(uint8_t *)0x0,puVar14,puVar13,puVar14,puVar13,puVar16,(uint8_t *)0x0,
                  uVar1);
      }
      iVar5 = 1;
      if ((0 < (int)uVar2 & (byte)(char)picture->colorspace >> 2) == 1) {
        puVar16 = picture->a;
        puVar4 = picture->argb;
        uVar11 = 0;
        do {
          if (0 < (int)uVar1) {
            iVar6 = picture->a_stride;
            iVar3 = picture->argb_stride;
            uVar15 = 0;
            do {
              *(uint8_t *)((long)puVar4 + uVar15 * 4 + (long)(int)(iVar3 * uVar11) * 4 + 3) =
                   puVar16[uVar15 + (long)(int)(iVar6 * uVar11)];
              uVar15 = uVar15 + 1;
            } while (uVar1 != uVar15);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
      }
    }
  }
  return iVar5;
}

Assistant:

int WebPPictureYUVAToARGB(WebPPicture* picture) {
  if (picture == NULL) return 0;
  if (picture->y == NULL || picture->u == NULL || picture->v == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if ((picture->colorspace & WEBP_CSP_ALPHA_BIT) && picture->a == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if ((picture->colorspace & WEBP_CSP_UV_MASK) != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  // Allocate a new argb buffer (discarding the previous one).
  if (!WebPPictureAllocARGB(picture)) return 0;
  picture->use_argb = 1;

  // Convert
  {
    int y;
    const int width = picture->width;
    const int height = picture->height;
    const int argb_stride = 4 * picture->argb_stride;
    uint8_t* dst = (uint8_t*)picture->argb;
    const uint8_t* cur_u = picture->u, *cur_v = picture->v, *cur_y = picture->y;
    WebPUpsampleLinePairFunc upsample =
        WebPGetLinePairConverter(ALPHA_OFFSET > 0);

    // First row, with replicated top samples.
    upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, width);
    cur_y += picture->y_stride;
    dst += argb_stride;
    // Center rows.
    for (y = 1; y + 1 < height; y += 2) {
      const uint8_t* const top_u = cur_u;
      const uint8_t* const top_v = cur_v;
      cur_u += picture->uv_stride;
      cur_v += picture->uv_stride;
      upsample(cur_y, cur_y + picture->y_stride, top_u, top_v, cur_u, cur_v,
               dst, dst + argb_stride, width);
      cur_y += 2 * picture->y_stride;
      dst += 2 * argb_stride;
    }
    // Last row (if needed), with replicated bottom samples.
    if (height > 1 && !(height & 1)) {
      upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, width);
    }
    // Insert alpha values if needed, in replacement for the default 0xff ones.
    if (picture->colorspace & WEBP_CSP_ALPHA_BIT) {
      for (y = 0; y < height; ++y) {
        uint32_t* const argb_dst = picture->argb + y * picture->argb_stride;
        const uint8_t* const src = picture->a + y * picture->a_stride;
        int x;
        for (x = 0; x < width; ++x) {
          argb_dst[x] = (argb_dst[x] & 0x00ffffffu) | ((uint32_t)src[x] << 24);
        }
      }
    }
  }
  return 1;
}